

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  byte bVar9;
  undefined1 auVar10 [32];
  int iVar11;
  AABBNodeMB4D *node1;
  ulong uVar12;
  uint uVar13;
  ulong *puVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar64 [64];
  undefined1 auVar68 [16];
  uint uVar70;
  uint uVar71;
  uint uVar72;
  undefined1 auVar69 [64];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_1660;
  RTCFilterFunctionNArguments local_15b0;
  undefined1 local_1580 [32];
  undefined1 local_1560 [16];
  undefined1 local_1550 [16];
  undefined1 local_1540 [16];
  undefined1 local_1530 [16];
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 local_1510;
  undefined8 uStack_1508;
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  undefined1 local_14b0 [16];
  float local_14a0 [4];
  undefined1 local_1490 [16];
  float local_1480 [4];
  undefined1 local_1470 [16];
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  RTCHitN local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 uStack_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  uint local_1260;
  uint uStack_125c;
  uint uStack_1258;
  uint uStack_1254;
  uint uStack_1250;
  uint uStack_124c;
  uint uStack_1248;
  uint uStack_1244;
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1340._4_4_ = fVar2;
  local_1340._0_4_ = fVar2;
  local_1340._8_4_ = fVar2;
  local_1340._12_4_ = fVar2;
  local_1340._16_4_ = fVar2;
  local_1340._20_4_ = fVar2;
  local_1340._24_4_ = fVar2;
  local_1340._28_4_ = fVar2;
  auVar50 = ZEXT3264(local_1340);
  fVar60 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1360._4_4_ = fVar60;
  local_1360._0_4_ = fVar60;
  local_1360._8_4_ = fVar60;
  local_1360._12_4_ = fVar60;
  local_1360._16_4_ = fVar60;
  local_1360._20_4_ = fVar60;
  local_1360._24_4_ = fVar60;
  local_1360._28_4_ = fVar60;
  auVar54 = ZEXT3264(local_1360);
  fVar65 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1380._4_4_ = fVar65;
  local_1380._0_4_ = fVar65;
  local_1380._8_4_ = fVar65;
  local_1380._12_4_ = fVar65;
  local_1380._16_4_ = fVar65;
  local_1380._20_4_ = fVar65;
  local_1380._24_4_ = fVar65;
  local_1380._28_4_ = fVar65;
  auVar55 = ZEXT3264(local_1380);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar60 = fVar60 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar65 = fVar65 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_13a0._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_13a0._8_4_ = -fVar2;
  local_13a0._12_4_ = -fVar2;
  local_13a0._16_4_ = -fVar2;
  local_13a0._20_4_ = -fVar2;
  local_13a0._24_4_ = -fVar2;
  local_13a0._28_4_ = -fVar2;
  auVar59 = ZEXT3264(local_13a0);
  local_13c0._0_8_ = CONCAT44(fVar60,fVar60) ^ 0x8000000080000000;
  local_13c0._8_4_ = -fVar60;
  local_13c0._12_4_ = -fVar60;
  local_13c0._16_4_ = -fVar60;
  local_13c0._20_4_ = -fVar60;
  local_13c0._24_4_ = -fVar60;
  local_13c0._28_4_ = -fVar60;
  auVar64 = ZEXT3264(local_13c0);
  iVar11 = (tray->tnear).field_0.i[k];
  local_13e0._4_4_ = iVar11;
  local_13e0._0_4_ = iVar11;
  local_13e0._8_4_ = iVar11;
  local_13e0._12_4_ = iVar11;
  local_13e0._16_4_ = iVar11;
  local_13e0._20_4_ = iVar11;
  local_13e0._24_4_ = iVar11;
  local_13e0._28_4_ = iVar11;
  auVar69 = ZEXT3264(local_13e0);
  local_1400._0_8_ = CONCAT44(fVar65,fVar65) ^ 0x8000000080000000;
  local_1400._8_4_ = -fVar65;
  local_1400._12_4_ = -fVar65;
  local_1400._16_4_ = -fVar65;
  local_1400._20_4_ = -fVar65;
  local_1400._24_4_ = -fVar65;
  local_1400._28_4_ = -fVar65;
  auVar75 = ZEXT3264(local_1400);
  iVar11 = (tray->tfar).field_0.i[k];
  local_1420._4_4_ = iVar11;
  local_1420._0_4_ = iVar11;
  local_1420._8_4_ = iVar11;
  local_1420._12_4_ = iVar11;
  local_1420._16_4_ = iVar11;
  local_1420._20_4_ = iVar11;
  local_1420._24_4_ = iVar11;
  local_1420._28_4_ = iVar11;
  auVar77 = ZEXT3264(local_1420);
  iVar11 = 1 << ((uint)k & 0x1f);
  auVar38._4_4_ = iVar11;
  auVar38._0_4_ = iVar11;
  auVar38._8_4_ = iVar11;
  auVar38._12_4_ = iVar11;
  auVar38._16_4_ = iVar11;
  auVar38._20_4_ = iVar11;
  auVar38._24_4_ = iVar11;
  auVar38._28_4_ = iVar11;
  auVar10 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar38 = vpand_avx2(auVar38,auVar10);
  local_1440 = vpcmpeqd_avx2(auVar38,auVar10);
  local_1660 = local_11f8;
LAB_016cd89a:
  do {
    puVar14 = local_1660;
    if (puVar14 == &local_1200) {
LAB_016ce2c1:
      return puVar14 != &local_1200;
    }
    local_1660 = puVar14 + -1;
    uVar20 = puVar14[-1];
    while ((uVar20 & 8) == 0) {
      uVar12 = uVar20 & 0xfffffffffffffff0;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar39._4_4_ = uVar3;
      auVar39._0_4_ = uVar3;
      auVar39._8_4_ = uVar3;
      auVar39._12_4_ = uVar3;
      auVar39._16_4_ = uVar3;
      auVar39._20_4_ = uVar3;
      auVar39._24_4_ = uVar3;
      auVar39._28_4_ = uVar3;
      auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar24),auVar39,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + uVar24));
      auVar68 = vfmadd213ps_fma(ZEXT1632(auVar68),auVar50._0_32_,auVar59._0_32_);
      auVar33 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar30),auVar39,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + uVar30));
      auVar33 = vfmadd213ps_fma(ZEXT1632(auVar33),auVar54._0_32_,auVar64._0_32_);
      auVar38 = vpmaxsd_avx2(ZEXT1632(auVar68),ZEXT1632(auVar33));
      auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar21),auVar39,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + uVar21));
      auVar68 = vfmadd213ps_fma(ZEXT1632(auVar68),auVar55._0_32_,auVar75._0_32_);
      auVar10 = vpmaxsd_avx2(ZEXT1632(auVar68),auVar69._0_32_);
      auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + (uVar24 ^ 0x20)),auVar39,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + (uVar24 ^ 0x20)));
      auVar38 = vpmaxsd_avx2(auVar38,auVar10);
      auVar33 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + (uVar30 ^ 0x20)),auVar39,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + (uVar30 ^ 0x20)));
      auVar68 = vfmadd213ps_fma(ZEXT1632(auVar68),auVar50._0_32_,auVar59._0_32_);
      auVar33 = vfmadd213ps_fma(ZEXT1632(auVar33),auVar54._0_32_,auVar64._0_32_);
      auVar10 = vpminsd_avx2(ZEXT1632(auVar68),ZEXT1632(auVar33));
      auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + (uVar21 ^ 0x20)),auVar39,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + (uVar21 ^ 0x20)));
      auVar68 = vfmadd213ps_fma(ZEXT1632(auVar68),auVar55._0_32_,auVar75._0_32_);
      auVar45 = vpminsd_avx2(ZEXT1632(auVar68),auVar77._0_32_);
      auVar10 = vpminsd_avx2(auVar10,auVar45);
      auVar38 = vcmpps_avx(auVar38,auVar10,2);
      if (((uint)uVar20 & 7) == 6) {
        auVar10 = vcmpps_avx(*(undefined1 (*) [32])(uVar12 + 0x1c0),auVar39,2);
        auVar45 = vcmpps_avx(auVar39,*(undefined1 (*) [32])(uVar12 + 0x1e0),1);
        auVar10 = vandps_avx(auVar10,auVar45);
        auVar38 = vandps_avx(auVar10,auVar38);
        auVar68 = vpackssdw_avx(auVar38._0_16_,auVar38._16_16_);
      }
      else {
        auVar68 = vpackssdw_avx(auVar38._0_16_,auVar38._16_16_);
      }
      auVar33 = vpsllw_avx(auVar68,0xf);
      auVar68 = vpacksswb_avx(auVar33,auVar33);
      bVar9 = SUB161(auVar68 >> 7,0) & 1 | (SUB161(auVar68 >> 0xf,0) & 1) << 1 |
              (SUB161(auVar68 >> 0x17,0) & 1) << 2 | (SUB161(auVar68 >> 0x1f,0) & 1) << 3 |
              (SUB161(auVar68 >> 0x27,0) & 1) << 4 | (SUB161(auVar68 >> 0x2f,0) & 1) << 5 |
              (SUB161(auVar68 >> 0x37,0) & 1) << 6 | SUB161(auVar68 >> 0x3f,0) << 7;
      if ((((((((auVar33 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar33 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar33 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar33 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar33 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar33 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar33 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar33[0xf])
      goto LAB_016cd89a;
      lVar19 = 0;
      for (uVar20 = (ulong)bVar9; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
        lVar19 = lVar19 + 1;
      }
      uVar20 = *(ulong *)(uVar12 + lVar19 * 8);
      uVar13 = bVar9 - 1 & (uint)bVar9;
      uVar15 = (ulong)uVar13;
      if (uVar13 != 0) {
        do {
          *local_1660 = uVar20;
          local_1660 = local_1660 + 1;
          lVar19 = 0;
          for (uVar20 = uVar15; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            lVar19 = lVar19 + 1;
          }
          uVar15 = uVar15 - 1 & uVar15;
          uVar20 = *(ulong *)(uVar12 + lVar19 * 8);
        } while (uVar15 != 0);
      }
    }
    uVar12 = uVar20 & 0xfffffffffffffff0;
    for (lVar19 = 0; lVar19 != (ulong)((uint)uVar20 & 0xf) - 8; lVar19 = lVar19 + 1) {
      lVar31 = lVar19 * 0x50;
      pSVar5 = context->scene;
      pGVar6 = (pSVar5->geometries).items[*(uint *)(uVar12 + 0x30 + lVar31)].ptr;
      fVar2 = (pGVar6->time_range).lower;
      fVar2 = pGVar6->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar2) / ((pGVar6->time_range).upper - fVar2));
      auVar68 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
      auVar68 = vminss_avx(auVar68,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
      auVar44 = vmaxss_avx(ZEXT816(0),auVar68);
      lVar16 = (long)(int)auVar44._0_4_ * 0x38;
      uVar32 = (ulong)*(uint *)(uVar12 + 4 + lVar31);
      lVar7 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar16);
      lVar16 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar16);
      auVar68 = *(undefined1 (*) [16])(lVar7 + (ulong)*(uint *)(uVar12 + lVar31) * 4);
      uVar22 = (ulong)*(uint *)(uVar12 + 0x10 + lVar31);
      auVar33 = *(undefined1 (*) [16])(lVar7 + uVar22 * 4);
      uVar25 = (ulong)*(uint *)(uVar12 + 0x20 + lVar31);
      auVar43 = *(undefined1 (*) [16])(lVar7 + uVar25 * 4);
      auVar34 = *(undefined1 (*) [16])(lVar7 + uVar32 * 4);
      uVar26 = (ulong)*(uint *)(uVar12 + 0x14 + lVar31);
      auVar63 = *(undefined1 (*) [16])(lVar7 + uVar26 * 4);
      uVar27 = (ulong)*(uint *)(uVar12 + 0x24 + lVar31);
      auVar47 = *(undefined1 (*) [16])(lVar7 + uVar27 * 4);
      uVar23 = (ulong)*(uint *)(uVar12 + 8 + lVar31);
      auVar40 = *(undefined1 (*) [16])(lVar7 + uVar23 * 4);
      uVar15 = (ulong)*(uint *)(uVar12 + 0x18 + lVar31);
      auVar57 = *(undefined1 (*) [16])(lVar7 + uVar15 * 4);
      uVar28 = (ulong)*(uint *)(uVar12 + 0x28 + lVar31);
      auVar41 = *(undefined1 (*) [16])(lVar7 + uVar28 * 4);
      uVar29 = (ulong)*(uint *)(uVar12 + 0xc + lVar31);
      auVar49 = *(undefined1 (*) [16])(lVar7 + uVar29 * 4);
      uVar17 = (ulong)*(uint *)(uVar12 + 0x1c + lVar31);
      auVar35 = *(undefined1 (*) [16])(lVar7 + uVar17 * 4);
      uVar18 = (ulong)*(uint *)(uVar12 + 0x2c + lVar31);
      auVar36 = *(undefined1 (*) [16])(lVar7 + uVar18 * 4);
      auVar37 = *(undefined1 (*) [16])(lVar16 + (ulong)*(uint *)(uVar12 + lVar31) * 4);
      auVar51 = *(undefined1 (*) [16])(lVar16 + uVar22 * 4);
      fVar2 = fVar2 - auVar44._0_4_;
      auVar44 = vunpcklps_avx(auVar68,auVar40);
      auVar40 = vunpckhps_avx(auVar68,auVar40);
      auVar46 = vunpcklps_avx(auVar34,auVar49);
      auVar34 = vunpckhps_avx(auVar34,auVar49);
      auVar68 = *(undefined1 (*) [16])(lVar16 + uVar32 * 4);
      local_1550 = vunpcklps_avx(auVar40,auVar34);
      auVar49 = vunpcklps_avx(auVar44,auVar46);
      auVar40 = vunpckhps_avx(auVar44,auVar46);
      auVar44 = vunpcklps_avx(auVar33,auVar57);
      auVar34 = vunpckhps_avx(auVar33,auVar57);
      auVar57 = vunpcklps_avx(auVar63,auVar35);
      auVar63 = vunpckhps_avx(auVar63,auVar35);
      auVar33 = *(undefined1 (*) [16])(lVar16 + uVar23 * 4);
      local_1540 = vunpcklps_avx(auVar34,auVar63);
      auVar35 = vunpcklps_avx(auVar44,auVar57);
      local_1560 = vunpckhps_avx(auVar44,auVar57);
      auVar44 = vunpcklps_avx(auVar43,auVar41);
      auVar63 = vunpckhps_avx(auVar43,auVar41);
      auVar41 = vunpcklps_avx(auVar47,auVar36);
      auVar57 = vunpckhps_avx(auVar47,auVar36);
      auVar34 = *(undefined1 (*) [16])(lVar16 + uVar29 * 4);
      auVar36 = vunpcklps_avx(auVar63,auVar57);
      auVar46 = vunpcklps_avx(auVar44,auVar41);
      local_1530 = vunpckhps_avx(auVar44,auVar41);
      auVar63 = vunpcklps_avx(auVar37,auVar33);
      auVar33 = vunpckhps_avx(auVar37,auVar33);
      auVar57 = vunpcklps_avx(auVar68,auVar34);
      auVar34 = vunpckhps_avx(auVar68,auVar34);
      auVar68 = *(undefined1 (*) [16])(lVar16 + uVar15 * 4);
      auVar41 = vunpcklps_avx(auVar33,auVar34);
      auVar37 = vunpcklps_avx(auVar63,auVar57);
      auVar34 = vunpckhps_avx(auVar63,auVar57);
      auVar57 = vunpcklps_avx(auVar51,auVar68);
      auVar63 = vunpckhps_avx(auVar51,auVar68);
      auVar68 = *(undefined1 (*) [16])(lVar16 + uVar26 * 4);
      auVar33 = *(undefined1 (*) [16])(lVar16 + uVar17 * 4);
      auVar51 = vunpcklps_avx(auVar68,auVar33);
      auVar68 = vunpckhps_avx(auVar68,auVar33);
      auVar44 = vunpcklps_avx(auVar63,auVar68);
      auVar43 = vunpcklps_avx(auVar57,auVar51);
      auVar63 = vunpckhps_avx(auVar57,auVar51);
      auVar68 = *(undefined1 (*) [16])(lVar16 + uVar25 * 4);
      auVar33 = *(undefined1 (*) [16])(lVar16 + uVar28 * 4);
      auVar51 = vunpcklps_avx(auVar68,auVar33);
      auVar57 = vunpckhps_avx(auVar68,auVar33);
      auVar68 = *(undefined1 (*) [16])(lVar16 + uVar27 * 4);
      auVar33 = *(undefined1 (*) [16])(lVar16 + uVar18 * 4);
      auVar47 = vunpcklps_avx(auVar68,auVar33);
      auVar68 = vunpckhps_avx(auVar68,auVar33);
      auVar33 = vunpcklps_avx(auVar57,auVar68);
      auVar57 = vunpcklps_avx(auVar51,auVar47);
      auVar68 = vunpckhps_avx(auVar51,auVar47);
      fVar60 = 1.0 - fVar2;
      auVar78._4_4_ = fVar60;
      auVar78._0_4_ = fVar60;
      auVar78._8_4_ = fVar60;
      auVar78._12_4_ = fVar60;
      auVar51._0_4_ = fVar2 * auVar37._0_4_;
      auVar51._4_4_ = fVar2 * auVar37._4_4_;
      auVar51._8_4_ = fVar2 * auVar37._8_4_;
      auVar51._12_4_ = fVar2 * auVar37._12_4_;
      auVar49 = vfmadd231ps_fma(auVar51,auVar78,auVar49);
      auVar56._0_4_ = fVar2 * auVar34._0_4_;
      auVar56._4_4_ = fVar2 * auVar34._4_4_;
      auVar56._8_4_ = fVar2 * auVar34._8_4_;
      auVar56._12_4_ = fVar2 * auVar34._12_4_;
      auVar37 = vfmadd231ps_fma(auVar56,auVar78,auVar40);
      auVar61._0_4_ = fVar2 * auVar41._0_4_;
      auVar61._4_4_ = fVar2 * auVar41._4_4_;
      auVar61._8_4_ = fVar2 * auVar41._8_4_;
      auVar61._12_4_ = fVar2 * auVar41._12_4_;
      auVar51 = vfmadd231ps_fma(auVar61,auVar78,local_1550);
      auVar34._0_4_ = fVar2 * auVar43._0_4_;
      auVar34._4_4_ = fVar2 * auVar43._4_4_;
      auVar34._8_4_ = fVar2 * auVar43._8_4_;
      auVar34._12_4_ = fVar2 * auVar43._12_4_;
      auVar34 = vfmadd231ps_fma(auVar34,auVar78,auVar35);
      auVar40._0_4_ = fVar2 * auVar63._0_4_;
      auVar40._4_4_ = fVar2 * auVar63._4_4_;
      auVar40._8_4_ = fVar2 * auVar63._8_4_;
      auVar40._12_4_ = fVar2 * auVar63._12_4_;
      auVar63 = vfmadd231ps_fma(auVar40,auVar78,local_1560);
      auVar43._0_4_ = fVar2 * auVar44._0_4_;
      auVar43._4_4_ = fVar2 * auVar44._4_4_;
      auVar43._8_4_ = fVar2 * auVar44._8_4_;
      auVar43._12_4_ = fVar2 * auVar44._12_4_;
      auVar40 = vfmadd231ps_fma(auVar43,auVar78,local_1540);
      puVar1 = (undefined8 *)(uVar12 + 0x30 + lVar31);
      local_1510 = *puVar1;
      uStack_1508 = puVar1[1];
      puVar1 = (undefined8 *)(uVar12 + 0x40 + lVar31);
      auVar47._0_4_ = fVar2 * auVar57._0_4_;
      auVar47._4_4_ = fVar2 * auVar57._4_4_;
      auVar47._8_4_ = fVar2 * auVar57._8_4_;
      auVar47._12_4_ = fVar2 * auVar57._12_4_;
      auVar73._0_4_ = fVar2 * auVar68._0_4_;
      auVar73._4_4_ = fVar2 * auVar68._4_4_;
      auVar73._8_4_ = fVar2 * auVar68._8_4_;
      auVar73._12_4_ = fVar2 * auVar68._12_4_;
      auVar80._0_4_ = fVar2 * auVar33._0_4_;
      auVar80._4_4_ = fVar2 * auVar33._4_4_;
      auVar80._8_4_ = fVar2 * auVar33._8_4_;
      auVar80._12_4_ = fVar2 * auVar33._12_4_;
      auVar57 = vfmadd231ps_fma(auVar47,auVar78,auVar46);
      auVar41 = vfmadd231ps_fma(auVar73,auVar78,local_1530);
      auVar35 = vfmadd231ps_fma(auVar80,auVar78,auVar36);
      local_1520 = *puVar1;
      uStack_1518 = puVar1[1];
      auVar33 = vsubps_avx(auVar49,auVar34);
      auVar68 = vsubps_avx(auVar37,auVar63);
      auVar34 = vsubps_avx(auVar51,auVar40);
      auVar63 = vsubps_avx(auVar57,auVar49);
      auVar40 = vsubps_avx(auVar41,auVar37);
      auVar57 = vsubps_avx(auVar35,auVar51);
      auVar41._0_4_ = auVar68._0_4_ * auVar57._0_4_;
      auVar41._4_4_ = auVar68._4_4_ * auVar57._4_4_;
      auVar41._8_4_ = auVar68._8_4_ * auVar57._8_4_;
      auVar41._12_4_ = auVar68._12_4_ * auVar57._12_4_;
      local_1470 = vfmsub231ps_fma(auVar41,auVar40,auVar34);
      auVar46._0_4_ = auVar34._0_4_ * auVar63._0_4_;
      auVar46._4_4_ = auVar34._4_4_ * auVar63._4_4_;
      auVar46._8_4_ = auVar34._8_4_ * auVar63._8_4_;
      auVar46._12_4_ = auVar34._12_4_ * auVar63._12_4_;
      local_1460 = vfmsub231ps_fma(auVar46,auVar57,auVar33);
      uVar3 = *(undefined4 *)(ray + k * 4);
      auVar44._4_4_ = uVar3;
      auVar44._0_4_ = uVar3;
      auVar44._8_4_ = uVar3;
      auVar44._12_4_ = uVar3;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar48._4_4_ = uVar3;
      auVar48._0_4_ = uVar3;
      auVar48._8_4_ = uVar3;
      auVar48._12_4_ = uVar3;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar35._4_4_ = uVar3;
      auVar35._0_4_ = uVar3;
      auVar35._8_4_ = uVar3;
      auVar35._12_4_ = uVar3;
      fVar2 = *(float *)(ray + k * 4 + 0x80);
      auVar79._4_4_ = fVar2;
      auVar79._0_4_ = fVar2;
      auVar79._8_4_ = fVar2;
      auVar79._12_4_ = fVar2;
      auVar41 = vsubps_avx(auVar49,auVar44);
      fVar60 = *(float *)(ray + k * 4 + 0xa0);
      auVar81._4_4_ = fVar60;
      auVar81._0_4_ = fVar60;
      auVar81._8_4_ = fVar60;
      auVar81._12_4_ = fVar60;
      auVar49 = vsubps_avx(auVar37,auVar48);
      fVar65 = *(float *)(ray + k * 4 + 0xc0);
      auVar82._4_4_ = fVar65;
      auVar82._0_4_ = fVar65;
      auVar82._8_4_ = fVar65;
      auVar82._12_4_ = fVar65;
      auVar35 = vsubps_avx(auVar51,auVar35);
      auVar36._0_4_ = fVar2 * auVar49._0_4_;
      auVar36._4_4_ = fVar2 * auVar49._4_4_;
      auVar36._8_4_ = fVar2 * auVar49._8_4_;
      auVar36._12_4_ = fVar2 * auVar49._12_4_;
      auVar36 = vfmsub231ps_fma(auVar36,auVar41,auVar81);
      auVar62._0_4_ = auVar57._0_4_ * auVar36._0_4_;
      auVar62._4_4_ = auVar57._4_4_ * auVar36._4_4_;
      auVar62._8_4_ = auVar57._8_4_ * auVar36._8_4_;
      auVar62._12_4_ = auVar57._12_4_ * auVar36._12_4_;
      auVar37._0_4_ = auVar34._0_4_ * auVar36._0_4_;
      auVar37._4_4_ = auVar34._4_4_ * auVar36._4_4_;
      auVar37._8_4_ = auVar34._8_4_ * auVar36._8_4_;
      auVar37._12_4_ = auVar34._12_4_ * auVar36._12_4_;
      auVar57._0_4_ = fVar65 * auVar41._0_4_;
      auVar57._4_4_ = fVar65 * auVar41._4_4_;
      auVar57._8_4_ = fVar65 * auVar41._8_4_;
      auVar57._12_4_ = fVar65 * auVar41._12_4_;
      auVar57 = vfmsub231ps_fma(auVar57,auVar35,auVar79);
      auVar34 = vfmadd231ps_fma(auVar62,auVar57,auVar40);
      auVar57 = vfmadd231ps_fma(auVar37,auVar68,auVar57);
      auVar58._0_4_ = auVar40._0_4_ * auVar33._0_4_;
      auVar58._4_4_ = auVar40._4_4_ * auVar33._4_4_;
      auVar58._8_4_ = auVar40._8_4_ * auVar33._8_4_;
      auVar58._12_4_ = auVar40._12_4_ * auVar33._12_4_;
      local_1450 = vfmsub231ps_fma(auVar58,auVar63,auVar68);
      auVar74._0_4_ = fVar60 * auVar35._0_4_;
      auVar74._4_4_ = fVar60 * auVar35._4_4_;
      auVar74._8_4_ = fVar60 * auVar35._8_4_;
      auVar74._12_4_ = fVar60 * auVar35._12_4_;
      auVar36 = vfmsub231ps_fma(auVar74,auVar49,auVar82);
      auVar76._0_4_ = fVar65 * local_1450._0_4_;
      auVar76._4_4_ = fVar65 * local_1450._4_4_;
      auVar76._8_4_ = fVar65 * local_1450._8_4_;
      auVar76._12_4_ = fVar65 * local_1450._12_4_;
      auVar68 = vfmadd231ps_fma(auVar76,local_1460,auVar81);
      auVar40 = vfmadd231ps_fma(auVar68,local_1470,auVar79);
      auVar68._8_4_ = 0x80000000;
      auVar68._0_8_ = 0x8000000080000000;
      auVar68._12_4_ = 0x80000000;
      auVar34 = vfmadd231ps_fma(auVar34,auVar36,auVar63);
      auVar68 = vandps_avx(auVar40,auVar68);
      uVar13 = auVar68._0_4_;
      local_1500._0_4_ = (float)(uVar13 ^ auVar34._0_4_);
      uVar70 = auVar68._4_4_;
      local_1500._4_4_ = (float)(uVar70 ^ auVar34._4_4_);
      uVar71 = auVar68._8_4_;
      local_1500._8_4_ = (float)(uVar71 ^ auVar34._8_4_);
      uVar72 = auVar68._12_4_;
      local_1500._12_4_ = (float)(uVar72 ^ auVar34._12_4_);
      auVar68 = vfmadd231ps_fma(auVar57,auVar33,auVar36);
      local_14f0._0_4_ = (float)(uVar13 ^ auVar68._0_4_);
      local_14f0._4_4_ = (float)(uVar70 ^ auVar68._4_4_);
      local_14f0._8_4_ = (float)(uVar71 ^ auVar68._8_4_);
      local_14f0._12_4_ = (float)(uVar72 ^ auVar68._12_4_);
      auVar34 = ZEXT816(0) << 0x20;
      auVar68 = vcmpps_avx(local_1500,auVar34,5);
      auVar33 = vcmpps_avx(local_14f0,auVar34,5);
      auVar68 = vandps_avx(auVar33,auVar68);
      auVar63._8_4_ = 0x7fffffff;
      auVar63._0_8_ = 0x7fffffff7fffffff;
      auVar63._12_4_ = 0x7fffffff;
      local_14d0 = vandps_avx(auVar40,auVar63);
      auVar33 = vcmpps_avx(auVar40,auVar34,4);
      auVar68 = vandps_avx(auVar33,auVar68);
      auVar33._0_4_ = local_1500._0_4_ + local_14f0._0_4_;
      auVar33._4_4_ = local_1500._4_4_ + local_14f0._4_4_;
      auVar33._8_4_ = local_1500._8_4_ + local_14f0._8_4_;
      auVar33._12_4_ = local_1500._12_4_ + local_14f0._12_4_;
      auVar33 = vcmpps_avx(auVar33,local_14d0,2);
      auVar34 = auVar33 & auVar68;
      if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar34[0xf] < '\0'
         ) {
        auVar68 = vandps_avx(auVar68,auVar33);
        auVar52._0_4_ = local_1450._0_4_ * auVar35._0_4_;
        auVar52._4_4_ = local_1450._4_4_ * auVar35._4_4_;
        auVar52._8_4_ = local_1450._8_4_ * auVar35._8_4_;
        auVar52._12_4_ = local_1450._12_4_ * auVar35._12_4_;
        auVar33 = vfmadd213ps_fma(auVar49,local_1460,auVar52);
        auVar33 = vfmadd213ps_fma(auVar41,local_1470,auVar33);
        local_14e0._0_4_ = (float)(uVar13 ^ auVar33._0_4_);
        local_14e0._4_4_ = (float)(uVar70 ^ auVar33._4_4_);
        local_14e0._8_4_ = (float)(uVar71 ^ auVar33._8_4_);
        local_14e0._12_4_ = (float)(uVar72 ^ auVar33._12_4_);
        fVar2 = *(float *)(ray + k * 4 + 0x60);
        auVar49._0_4_ = local_14d0._0_4_ * fVar2;
        auVar49._4_4_ = local_14d0._4_4_ * fVar2;
        auVar49._8_4_ = local_14d0._8_4_ * fVar2;
        auVar49._12_4_ = local_14d0._12_4_ * fVar2;
        auVar33 = vcmpps_avx(auVar49,local_14e0,1);
        fVar2 = *(float *)(ray + k * 4 + 0x100);
        auVar53._0_4_ = local_14d0._0_4_ * fVar2;
        auVar53._4_4_ = local_14d0._4_4_ * fVar2;
        auVar53._8_4_ = local_14d0._8_4_ * fVar2;
        auVar53._12_4_ = local_14d0._12_4_ * fVar2;
        auVar34 = vcmpps_avx(local_14e0,auVar53,2);
        auVar33 = vandps_avx(auVar33,auVar34);
        local_14b0 = vandps_avx(auVar33,auVar68);
        uVar13 = vmovmskps_avx(local_14b0);
        if (uVar13 != 0) {
          auVar68 = vrcpps_avx(local_14d0);
          auVar42._8_4_ = 0x3f800000;
          auVar42._0_8_ = 0x3f8000003f800000;
          auVar42._12_4_ = 0x3f800000;
          auVar33 = vfnmadd213ps_fma(local_14d0,auVar68,auVar42);
          auVar68 = vfmadd132ps_fma(auVar33,auVar68,auVar68);
          fVar60 = auVar68._0_4_;
          fVar65 = auVar68._4_4_;
          fVar66 = auVar68._8_4_;
          fVar67 = auVar68._12_4_;
          local_1480[0] = fVar60 * local_14e0._0_4_;
          local_1480[1] = fVar65 * local_14e0._4_4_;
          local_1480[2] = fVar66 * local_14e0._8_4_;
          local_1480[3] = fVar67 * local_14e0._12_4_;
          local_14a0[0] = fVar60 * local_1500._0_4_;
          local_14a0[1] = fVar65 * local_1500._4_4_;
          local_14a0[2] = fVar66 * local_1500._8_4_;
          local_14a0[3] = fVar67 * local_1500._12_4_;
          local_1490._0_4_ = fVar60 * local_14f0._0_4_;
          local_1490._4_4_ = fVar65 * local_14f0._4_4_;
          local_1490._8_4_ = fVar66 * local_14f0._8_4_;
          local_1490._12_4_ = fVar67 * local_14f0._12_4_;
          uVar15 = (ulong)(uVar13 & 0xff);
          do {
            uVar17 = 0;
            for (uVar18 = uVar15; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
              uVar17 = uVar17 + 1;
            }
            local_1260 = *(uint *)((long)&local_1510 + uVar17 * 4);
            pGVar6 = (pSVar5->geometries).items[local_1260].ptr;
            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                uVar18 = (ulong)(uint)((int)uVar17 * 4);
                uVar3 = *(undefined4 *)((long)local_14a0 + uVar18);
                local_12c0._4_4_ = uVar3;
                local_12c0._0_4_ = uVar3;
                local_12c0._8_4_ = uVar3;
                local_12c0._12_4_ = uVar3;
                local_12c0._16_4_ = uVar3;
                local_12c0._20_4_ = uVar3;
                local_12c0._24_4_ = uVar3;
                local_12c0._28_4_ = uVar3;
                local_12a0 = *(undefined4 *)(local_1490 + uVar18);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_1480 + uVar18);
                local_15b0.context = context->user;
                uVar3 = *(undefined4 *)((long)&local_1520 + uVar18);
                local_1280._4_4_ = uVar3;
                local_1280._0_4_ = uVar3;
                local_1280._8_4_ = uVar3;
                local_1280._12_4_ = uVar3;
                local_1280._16_4_ = uVar3;
                local_1280._20_4_ = uVar3;
                local_1280._24_4_ = uVar3;
                local_1280._28_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_1470 + uVar18);
                uVar4 = *(undefined4 *)(local_1460 + uVar18);
                local_1300._4_4_ = uVar4;
                local_1300._0_4_ = uVar4;
                local_1300._8_4_ = uVar4;
                local_1300._12_4_ = uVar4;
                local_1300._16_4_ = uVar4;
                local_1300._20_4_ = uVar4;
                local_1300._24_4_ = uVar4;
                local_1300._28_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_1450 + uVar18);
                local_12e0._4_4_ = uVar4;
                local_12e0._0_4_ = uVar4;
                local_12e0._8_4_ = uVar4;
                local_12e0._12_4_ = uVar4;
                local_12e0._16_4_ = uVar4;
                local_12e0._20_4_ = uVar4;
                local_12e0._24_4_ = uVar4;
                local_12e0._28_4_ = uVar4;
                local_1320[0] = (RTCHitN)(char)uVar3;
                local_1320[1] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1320[2] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1320[3] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1320[4] = (RTCHitN)(char)uVar3;
                local_1320[5] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1320[6] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1320[7] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1320[8] = (RTCHitN)(char)uVar3;
                local_1320[9] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1320[10] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1320[0xb] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1320[0xc] = (RTCHitN)(char)uVar3;
                local_1320[0xd] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1320[0xe] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1320[0xf] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1320[0x10] = (RTCHitN)(char)uVar3;
                local_1320[0x11] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1320[0x12] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1320[0x13] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1320[0x14] = (RTCHitN)(char)uVar3;
                local_1320[0x15] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1320[0x16] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1320[0x17] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1320[0x18] = (RTCHitN)(char)uVar3;
                local_1320[0x19] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1320[0x1a] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1320[0x1b] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1320[0x1c] = (RTCHitN)(char)uVar3;
                local_1320[0x1d] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1320[0x1e] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1320[0x1f] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                uStack_129c = local_12a0;
                uStack_1298 = local_12a0;
                uStack_1294 = local_12a0;
                uStack_1290 = local_12a0;
                uStack_128c = local_12a0;
                uStack_1288 = local_12a0;
                uStack_1284 = local_12a0;
                uStack_125c = local_1260;
                uStack_1258 = local_1260;
                uStack_1254 = local_1260;
                uStack_1250 = local_1260;
                uStack_124c = local_1260;
                uStack_1248 = local_1260;
                uStack_1244 = local_1260;
                vpcmpeqd_avx2(local_12c0,local_12c0);
                uStack_123c = (local_15b0.context)->instID[0];
                local_1240 = uStack_123c;
                uStack_1238 = uStack_123c;
                uStack_1234 = uStack_123c;
                uStack_1230 = uStack_123c;
                uStack_122c = uStack_123c;
                uStack_1228 = uStack_123c;
                uStack_1224 = uStack_123c;
                uStack_121c = (local_15b0.context)->instPrimID[0];
                local_1220 = uStack_121c;
                uStack_1218 = uStack_121c;
                uStack_1214 = uStack_121c;
                uStack_1210 = uStack_121c;
                uStack_120c = uStack_121c;
                uStack_1208 = uStack_121c;
                uStack_1204 = uStack_121c;
                local_1580 = local_1440;
                local_15b0.valid = (int *)local_1580;
                local_15b0.geometryUserPtr = pGVar6->userPtr;
                local_15b0.hit = local_1320;
                local_15b0.N = 8;
                local_15b0.ray = (RTCRayN *)ray;
                if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar6->occlusionFilterN)(&local_15b0);
                }
                auVar10 = vpcmpeqd_avx2(local_1580,_DAT_01f7b000);
                auVar38 = _DAT_01f7b020 & ~auVar10;
                if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar38 >> 0x7f,0) == '\0') &&
                      (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar38 >> 0xbf,0) == '\0') &&
                    (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar38[0x1f]) {
                  auVar10 = auVar10 ^ _DAT_01f7b020;
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var8)(&local_15b0);
                  }
                  auVar38 = vpcmpeqd_avx2(local_1580,_DAT_01f7b000);
                  auVar10 = auVar38 ^ _DAT_01f7b020;
                  auVar45._8_4_ = 0xff800000;
                  auVar45._0_8_ = 0xff800000ff800000;
                  auVar45._12_4_ = 0xff800000;
                  auVar45._16_4_ = 0xff800000;
                  auVar45._20_4_ = 0xff800000;
                  auVar45._24_4_ = 0xff800000;
                  auVar45._28_4_ = 0xff800000;
                  auVar38 = vblendvps_avx(auVar45,*(undefined1 (*) [32])(local_15b0.ray + 0x100),
                                          auVar38);
                  *(undefined1 (*) [32])(local_15b0.ray + 0x100) = auVar38;
                }
                if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar10 >> 0x7f,0) == '\0') &&
                      (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar10 >> 0xbf,0) == '\0') &&
                    (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar10[0x1f]) {
                  *(float *)(ray + k * 4 + 0x100) = fVar2;
                  goto LAB_016ce1ec;
                }
              }
              *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
              goto LAB_016ce2c1;
            }
LAB_016ce1ec:
            uVar15 = uVar15 ^ 1L << (uVar17 & 0x3f);
          } while (uVar15 != 0);
        }
      }
      auVar50 = ZEXT3264(local_1340);
      auVar54 = ZEXT3264(local_1360);
      auVar55 = ZEXT3264(local_1380);
      auVar59 = ZEXT3264(local_13a0);
      auVar64 = ZEXT3264(local_13c0);
      auVar69 = ZEXT3264(local_13e0);
      auVar75 = ZEXT3264(local_1400);
      auVar77 = ZEXT3264(local_1420);
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }